

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  long lVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong unaff_R14;
  size_t mask;
  ulong uVar31;
  Primitive *prim;
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24e1;
  ulong local_24e0;
  ulong local_24d8;
  ulong local_24d0;
  ulong local_24c8;
  ulong local_24c0;
  ulong local_24b8;
  undefined1 (*local_24b0) [16];
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_24b0 = (undefined1 (*) [16])local_2390;
      auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar38 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar4 = (ray->super_RayK<1>).dir.field_0;
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx((undefined1  [16])aVar4,auVar37);
      auVar50._8_4_ = 0x219392ef;
      auVar50._0_8_ = 0x219392ef219392ef;
      auVar50._12_4_ = 0x219392ef;
      auVar37 = vcmpps_avx(auVar37,auVar50,1);
      auVar37 = vblendvps_avx((undefined1  [16])aVar4,auVar50,auVar37);
      auVar50 = vrcpps_avx(auVar37);
      fVar9 = auVar50._0_4_;
      auVar40._0_4_ = auVar37._0_4_ * fVar9;
      fVar10 = auVar50._4_4_;
      auVar40._4_4_ = auVar37._4_4_ * fVar10;
      fVar11 = auVar50._8_4_;
      auVar40._8_4_ = auVar37._8_4_ * fVar11;
      fVar12 = auVar50._12_4_;
      auVar40._12_4_ = auVar37._12_4_ * fVar12;
      auVar51._8_4_ = 0x3f800000;
      auVar51._0_8_ = &DAT_3f8000003f800000;
      auVar51._12_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar51,auVar40);
      uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar3;
      local_23c0._0_4_ = uVar3;
      local_23c0._8_4_ = uVar3;
      local_23c0._12_4_ = uVar3;
      local_23c0._16_4_ = uVar3;
      local_23c0._20_4_ = uVar3;
      local_23c0._24_4_ = uVar3;
      local_23c0._28_4_ = uVar3;
      auVar55 = ZEXT3264(local_23c0);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar3;
      local_23e0._0_4_ = uVar3;
      local_23e0._8_4_ = uVar3;
      local_23e0._12_4_ = uVar3;
      local_23e0._16_4_ = uVar3;
      local_23e0._20_4_ = uVar3;
      local_23e0._24_4_ = uVar3;
      local_23e0._28_4_ = uVar3;
      auVar57 = ZEXT3264(local_23e0);
      auVar41._0_4_ = fVar9 + fVar9 * auVar37._0_4_;
      auVar41._4_4_ = fVar10 + fVar10 * auVar37._4_4_;
      auVar41._8_4_ = fVar11 + fVar11 * auVar37._8_4_;
      auVar41._12_4_ = fVar12 + fVar12 * auVar37._12_4_;
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar3;
      local_2400._0_4_ = uVar3;
      local_2400._8_4_ = uVar3;
      local_2400._12_4_ = uVar3;
      local_2400._16_4_ = uVar3;
      local_2400._20_4_ = uVar3;
      local_2400._24_4_ = uVar3;
      local_2400._28_4_ = uVar3;
      auVar59 = ZEXT3264(local_2400);
      auVar37 = vshufps_avx(auVar41,auVar41,0);
      local_2420._16_16_ = auVar37;
      local_2420._0_16_ = auVar37;
      auVar60 = ZEXT3264(local_2420);
      auVar37 = vmovshdup_avx(auVar41);
      auVar49 = ZEXT1664(auVar37);
      auVar50 = vshufps_avx(auVar41,auVar41,0x55);
      local_2440._16_16_ = auVar50;
      local_2440._0_16_ = auVar50;
      auVar61 = ZEXT3264(local_2440);
      auVar50 = vshufpd_avx(auVar41,auVar41,1);
      auVar53 = ZEXT1664(auVar50);
      auVar40 = vshufps_avx(auVar41,auVar41,0xaa);
      auVar45 = ZEXT1664(auVar40);
      local_24c0 = (ulong)(auVar41._0_4_ < 0.0) << 5;
      local_24c8 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x40;
      local_2460._16_16_ = auVar40;
      local_2460._0_16_ = auVar40;
      auVar62 = ZEXT3264(local_2460);
      local_24d0 = (ulong)(auVar50._0_4_ < 0.0) << 5 | 0x80;
      local_24d8 = local_24c0 ^ 0x20;
      local_24e0 = local_24c8 ^ 0x20;
      local_24a8 = local_24d0 ^ 0x20;
      auVar37 = vshufps_avx(auVar33,auVar33,0);
      local_2480._16_16_ = auVar37;
      local_2480._0_16_ = auVar37;
      auVar63 = ZEXT3264(local_2480);
      auVar37 = vshufps_avx(auVar38,auVar38,0);
      auVar32 = ZEXT3264(CONCAT1616(auVar37,auVar37));
      uVar25 = local_24d0;
      uVar26 = local_24d8;
      uVar27 = local_24e0;
      uVar28 = local_24c0;
      uVar30 = local_24c8;
      do {
        fVar9 = (ray->super_RayK<1>).tfar;
        auVar36 = ZEXT464((uint)fVar9);
        do {
          if (local_24b0 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar20 = local_24b0 + -1;
          local_24b0 = local_24b0 + -1;
        } while (fVar9 < *(float *)(*pauVar20 + 8));
        uVar31 = *(ulong *)*local_24b0;
        do {
          auVar58 = auVar59._0_32_;
          auVar56 = auVar57._0_32_;
          auVar54 = auVar55._0_32_;
          if ((uVar31 & 8) == 0) {
            uVar19 = uVar31 & 0xfffffffffffffff0;
            fVar9 = (ray->super_RayK<1>).dir.field_0.m128[3];
            auVar39._4_4_ = fVar9;
            auVar39._0_4_ = fVar9;
            auVar39._8_4_ = fVar9;
            auVar39._12_4_ = fVar9;
            auVar39._16_4_ = fVar9;
            auVar39._20_4_ = fVar9;
            auVar39._24_4_ = fVar9;
            auVar39._28_4_ = fVar9;
            pfVar2 = (float *)(uVar19 + 0x100 + uVar28);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar28);
            auVar35._0_4_ = fVar9 * *pfVar2 + *pfVar1;
            auVar35._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
            auVar35._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
            auVar35._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
            auVar35._16_4_ = fVar9 * pfVar2[4] + pfVar1[4];
            auVar35._20_4_ = fVar9 * pfVar2[5] + pfVar1[5];
            auVar35._24_4_ = fVar9 * pfVar2[6] + pfVar1[6];
            auVar35._28_4_ = auVar36._28_4_ + pfVar1[7];
            auVar35 = vsubps_avx(auVar35,auVar54);
            auVar13._4_4_ = auVar60._4_4_ * auVar35._4_4_;
            auVar13._0_4_ = auVar60._0_4_ * auVar35._0_4_;
            auVar13._8_4_ = auVar60._8_4_ * auVar35._8_4_;
            auVar13._12_4_ = auVar60._12_4_ * auVar35._12_4_;
            auVar13._16_4_ = auVar60._16_4_ * auVar35._16_4_;
            auVar13._20_4_ = auVar60._20_4_ * auVar35._20_4_;
            auVar13._24_4_ = auVar60._24_4_ * auVar35._24_4_;
            auVar13._28_4_ = auVar35._28_4_;
            pfVar2 = (float *)(uVar19 + 0x100 + uVar30);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar30);
            auVar43._0_4_ = fVar9 * *pfVar2 + *pfVar1;
            auVar43._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
            auVar43._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
            auVar43._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
            auVar43._16_4_ = fVar9 * pfVar2[4] + pfVar1[4];
            auVar43._20_4_ = fVar9 * pfVar2[5] + pfVar1[5];
            auVar43._24_4_ = fVar9 * pfVar2[6] + pfVar1[6];
            auVar43._28_4_ = auVar45._28_4_ + pfVar1[7];
            auVar35 = vmaxps_avx(auVar63._0_32_,auVar13);
            auVar13 = vsubps_avx(auVar43,auVar56);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar25);
            auVar8._4_4_ = auVar61._4_4_ * auVar13._4_4_;
            auVar8._0_4_ = auVar61._0_4_ * auVar13._0_4_;
            auVar8._8_4_ = auVar61._8_4_ * auVar13._8_4_;
            auVar8._12_4_ = auVar61._12_4_ * auVar13._12_4_;
            auVar8._16_4_ = auVar61._16_4_ * auVar13._16_4_;
            auVar8._20_4_ = auVar61._20_4_ * auVar13._20_4_;
            auVar8._24_4_ = auVar61._24_4_ * auVar13._24_4_;
            auVar8._28_4_ = auVar13._28_4_;
            pfVar1 = (float *)(uVar19 + 0x40 + uVar25);
            auVar47._0_4_ = fVar9 * *pfVar2 + *pfVar1;
            auVar47._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
            auVar47._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
            auVar47._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
            auVar47._16_4_ = fVar9 * pfVar2[4] + pfVar1[4];
            auVar47._20_4_ = fVar9 * pfVar2[5] + pfVar1[5];
            auVar47._24_4_ = fVar9 * pfVar2[6] + pfVar1[6];
            auVar47._28_4_ = auVar49._28_4_ + pfVar1[7];
            auVar13 = vsubps_avx(auVar47,auVar58);
            auVar14._4_4_ = auVar62._4_4_ * auVar13._4_4_;
            auVar14._0_4_ = auVar62._0_4_ * auVar13._0_4_;
            auVar14._8_4_ = auVar62._8_4_ * auVar13._8_4_;
            auVar14._12_4_ = auVar62._12_4_ * auVar13._12_4_;
            auVar14._16_4_ = auVar62._16_4_ * auVar13._16_4_;
            auVar14._20_4_ = auVar62._20_4_ * auVar13._20_4_;
            fVar10 = auVar13._28_4_;
            auVar14._24_4_ = auVar62._24_4_ * auVar13._24_4_;
            auVar14._28_4_ = fVar10;
            auVar13 = vmaxps_avx(auVar8,auVar14);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar26);
            local_24a0 = vmaxps_avx(auVar35,auVar13);
            auVar36 = ZEXT3264(local_24a0);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar26);
            auVar44._0_4_ = fVar9 * *pfVar2 + *pfVar1;
            auVar44._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
            auVar44._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
            auVar44._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
            auVar44._16_4_ = fVar9 * pfVar2[4] + pfVar1[4];
            auVar44._20_4_ = fVar9 * pfVar2[5] + pfVar1[5];
            auVar44._24_4_ = fVar9 * pfVar2[6] + pfVar1[6];
            auVar44._28_4_ = fVar10 + pfVar1[7];
            auVar35 = vsubps_avx(auVar44,auVar54);
            pfVar2 = (float *)(uVar19 + 0x100 + uVar27);
            pfVar1 = (float *)(uVar19 + 0x40 + uVar27);
            auVar48._0_4_ = fVar9 * *pfVar2 + *pfVar1;
            auVar48._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
            auVar48._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
            auVar48._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
            auVar48._16_4_ = fVar9 * pfVar2[4] + pfVar1[4];
            auVar48._20_4_ = fVar9 * pfVar2[5] + pfVar1[5];
            auVar48._24_4_ = fVar9 * pfVar2[6] + pfVar1[6];
            auVar48._28_4_ = fVar10 + pfVar1[7];
            auVar15._4_4_ = auVar60._4_4_ * auVar35._4_4_;
            auVar15._0_4_ = auVar60._0_4_ * auVar35._0_4_;
            auVar15._8_4_ = auVar60._8_4_ * auVar35._8_4_;
            auVar15._12_4_ = auVar60._12_4_ * auVar35._12_4_;
            auVar15._16_4_ = auVar60._16_4_ * auVar35._16_4_;
            auVar15._20_4_ = auVar60._20_4_ * auVar35._20_4_;
            auVar15._24_4_ = auVar60._24_4_ * auVar35._24_4_;
            auVar15._28_4_ = auVar35._28_4_;
            auVar35 = vsubps_avx(auVar48,auVar56);
            pfVar2 = (float *)(uVar19 + 0x100 + local_24a8);
            auVar16._4_4_ = auVar61._4_4_ * auVar35._4_4_;
            auVar16._0_4_ = auVar61._0_4_ * auVar35._0_4_;
            auVar16._8_4_ = auVar61._8_4_ * auVar35._8_4_;
            auVar16._12_4_ = auVar61._12_4_ * auVar35._12_4_;
            auVar16._16_4_ = auVar61._16_4_ * auVar35._16_4_;
            auVar16._20_4_ = auVar61._20_4_ * auVar35._20_4_;
            auVar16._24_4_ = auVar61._24_4_ * auVar35._24_4_;
            auVar16._28_4_ = auVar35._28_4_;
            pfVar1 = (float *)(uVar19 + 0x40 + local_24a8);
            auVar52._0_4_ = fVar9 * *pfVar2 + *pfVar1;
            auVar52._4_4_ = fVar9 * pfVar2[1] + pfVar1[1];
            auVar52._8_4_ = fVar9 * pfVar2[2] + pfVar1[2];
            auVar52._12_4_ = fVar9 * pfVar2[3] + pfVar1[3];
            auVar52._16_4_ = fVar9 * pfVar2[4] + pfVar1[4];
            auVar52._20_4_ = fVar9 * pfVar2[5] + pfVar1[5];
            auVar52._24_4_ = fVar9 * pfVar2[6] + pfVar1[6];
            auVar52._28_4_ = auVar53._28_4_ + pfVar1[7];
            auVar35 = vsubps_avx(auVar52,auVar58);
            auVar17._4_4_ = auVar62._4_4_ * auVar35._4_4_;
            auVar17._0_4_ = auVar62._0_4_ * auVar35._0_4_;
            auVar17._8_4_ = auVar62._8_4_ * auVar35._8_4_;
            auVar17._12_4_ = auVar62._12_4_ * auVar35._12_4_;
            auVar17._16_4_ = auVar62._16_4_ * auVar35._16_4_;
            auVar17._20_4_ = auVar62._20_4_ * auVar35._20_4_;
            auVar17._24_4_ = auVar62._24_4_ * auVar35._24_4_;
            auVar17._28_4_ = auVar35._28_4_;
            auVar53 = ZEXT3264(auVar17);
            auVar13 = vminps_avx(auVar16,auVar17);
            auVar35 = vminps_avx(auVar32._0_32_,auVar15);
            auVar35 = vminps_avx(auVar35,auVar13);
            auVar35 = vcmpps_avx(local_24a0,auVar35,2);
            auVar45 = ZEXT3264(auVar35);
            if (((uint)uVar31 & 7) == 6) {
              auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar39,2);
              auVar8 = vcmpps_avx(auVar39,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
              auVar8 = vandps_avx(auVar13,auVar8);
              auVar35 = vandps_avx(auVar8,auVar35);
              auVar45 = ZEXT1664(auVar35._16_16_);
              auVar37 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
            }
            else {
              auVar37 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
            }
            auVar49 = ZEXT3264(auVar13);
            auVar37 = vpsllw_avx(auVar37,0xf);
            auVar37 = vpacksswb_avx(auVar37,auVar37);
            unaff_R14 = (ulong)(byte)(SUB161(auVar37 >> 7,0) & 1 |
                                      (SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar37 >> 0x3f,0) << 7);
          }
          if ((uVar31 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar18 = 4;
            }
            else {
              uVar19 = uVar31 & 0xfffffffffffffff0;
              lVar29 = 0;
              if (unaff_R14 != 0) {
                for (; (unaff_R14 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              iVar18 = 0;
              uVar31 = *(ulong *)(uVar19 + lVar29 * 8);
              uVar24 = unaff_R14 - 1 & unaff_R14;
              if (uVar24 != 0) {
                uVar5 = *(uint *)(local_24a0 + lVar29 * 4);
                lVar29 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                uVar7 = *(ulong *)(uVar19 + lVar29 * 8);
                uVar6 = *(uint *)(local_24a0 + lVar29 * 4);
                uVar24 = uVar24 - 1 & uVar24;
                uVar25 = local_24d0;
                uVar26 = local_24d8;
                uVar27 = local_24e0;
                if (uVar24 == 0) {
                  if (uVar5 < uVar6) {
                    *(ulong *)*local_24b0 = uVar7;
                    *(uint *)(*local_24b0 + 8) = uVar6;
                    local_24b0 = local_24b0 + 1;
                  }
                  else {
                    *(ulong *)*local_24b0 = uVar31;
                    *(uint *)(*local_24b0 + 8) = uVar5;
                    local_24b0 = local_24b0 + 1;
                    uVar31 = uVar7;
                  }
                }
                else {
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = uVar31;
                  auVar37 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar5));
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar7;
                  auVar33 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar6));
                  lVar29 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = *(ulong *)(uVar19 + lVar29 * 8);
                  auVar38 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_24a0 + lVar29 * 4)));
                  uVar24 = uVar24 - 1 & uVar24;
                  if (uVar24 == 0) {
                    auVar50 = vpcmpgtd_avx(auVar33,auVar37);
                    auVar40 = vpshufd_avx(auVar50,0xaa);
                    auVar50 = vblendvps_avx(auVar33,auVar37,auVar40);
                    auVar37 = vblendvps_avx(auVar37,auVar33,auVar40);
                    auVar33 = vpcmpgtd_avx(auVar38,auVar50);
                    auVar40 = vpshufd_avx(auVar33,0xaa);
                    auVar33 = vblendvps_avx(auVar38,auVar50,auVar40);
                    auVar49 = ZEXT1664(auVar33);
                    auVar38 = vblendvps_avx(auVar50,auVar38,auVar40);
                    auVar50 = vpcmpgtd_avx(auVar38,auVar37);
                    auVar40 = vpshufd_avx(auVar50,0xaa);
                    auVar45 = ZEXT1664(auVar40);
                    auVar50 = vblendvps_avx(auVar38,auVar37,auVar40);
                    auVar53 = ZEXT1664(auVar50);
                    auVar37 = vblendvps_avx(auVar37,auVar38,auVar40);
                    auVar36 = ZEXT1664(auVar37);
                    *local_24b0 = auVar37;
                    local_24b0[1] = auVar50;
                    uVar31 = auVar33._0_8_;
                    local_24b0 = local_24b0 + 2;
                  }
                  else {
                    lVar29 = 0;
                    if (uVar24 != 0) {
                      for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                      }
                    }
                    auVar53 = ZEXT464(*(uint *)(local_24a0 + lVar29 * 4));
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = *(ulong *)(uVar19 + lVar29 * 8);
                    auVar50 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_24a0 + lVar29 * 4)));
                    uVar24 = uVar24 - 1 & uVar24;
                    if (uVar24 == 0) {
                      auVar40 = vpcmpgtd_avx(auVar33,auVar37);
                      auVar41 = vpshufd_avx(auVar40,0xaa);
                      auVar40 = vblendvps_avx(auVar33,auVar37,auVar41);
                      auVar37 = vblendvps_avx(auVar37,auVar33,auVar41);
                      auVar33 = vpcmpgtd_avx(auVar50,auVar38);
                      auVar41 = vpshufd_avx(auVar33,0xaa);
                      auVar33 = vblendvps_avx(auVar50,auVar38,auVar41);
                      auVar38 = vblendvps_avx(auVar38,auVar50,auVar41);
                      auVar50 = vpcmpgtd_avx(auVar38,auVar37);
                      auVar41 = vpshufd_avx(auVar50,0xaa);
                      auVar50 = vblendvps_avx(auVar38,auVar37,auVar41);
                      auVar37 = vblendvps_avx(auVar37,auVar38,auVar41);
                      auVar38 = vpcmpgtd_avx(auVar33,auVar40);
                      auVar41 = vpshufd_avx(auVar38,0xaa);
                      auVar38 = vblendvps_avx(auVar33,auVar40,auVar41);
                      auVar33 = vblendvps_avx(auVar40,auVar33,auVar41);
                      auVar40 = vpcmpgtd_avx(auVar50,auVar33);
                      auVar41 = vpshufd_avx(auVar40,0xaa);
                      auVar53 = ZEXT1664(auVar41);
                      auVar40 = vblendvps_avx(auVar50,auVar33,auVar41);
                      auVar33 = vblendvps_avx(auVar33,auVar50,auVar41);
                      *local_24b0 = auVar37;
                      local_24b0[1] = auVar33;
                      local_24b0[2] = auVar40;
                      uVar31 = auVar38._0_8_;
                      pauVar20 = local_24b0 + 3;
                    }
                    else {
                      *local_24b0 = auVar37;
                      local_24b0[1] = auVar33;
                      local_24b0[2] = auVar38;
                      local_24b0[3] = auVar50;
                      lVar29 = 0x30;
                      do {
                        lVar22 = lVar29;
                        lVar29 = 0;
                        if (uVar24 != 0) {
                          for (; (uVar24 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                          }
                        }
                        auVar34._8_8_ = 0;
                        auVar34._0_8_ = *(ulong *)(uVar19 + lVar29 * 8);
                        auVar37 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_24a0 + lVar29 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(local_24b0[1] + lVar22) = auVar37;
                        uVar24 = uVar24 & uVar24 - 1;
                        lVar29 = lVar22 + 0x10;
                      } while (uVar24 != 0);
                      pauVar20 = (undefined1 (*) [16])(local_24b0[1] + lVar22);
                      if (lVar22 + 0x10 != 0) {
                        lVar29 = 0x10;
                        pauVar21 = local_24b0;
                        do {
                          auVar37 = pauVar21[1];
                          uVar5 = *(uint *)(pauVar21[1] + 8);
                          pauVar21 = pauVar21 + 1;
                          lVar22 = lVar29;
                          do {
                            if (uVar5 <= *(uint *)(local_24b0[-1] + lVar22 + 8)) {
                              pauVar23 = (undefined1 (*) [16])(*local_24b0 + lVar22);
                              break;
                            }
                            *(undefined1 (*) [16])(*local_24b0 + lVar22) =
                                 *(undefined1 (*) [16])(local_24b0[-1] + lVar22);
                            lVar22 = lVar22 + -0x10;
                            pauVar23 = local_24b0;
                          } while (lVar22 != 0);
                          *pauVar23 = auVar37;
                          lVar29 = lVar29 + 0x10;
                        } while (pauVar20 != pauVar21);
                      }
                      uVar31 = *(ulong *)*pauVar20;
                    }
                    auVar36 = ZEXT1664(auVar37);
                    auVar49 = ZEXT1664(auVar50);
                    auVar45 = ZEXT1664(auVar38);
                    auVar55 = ZEXT3264(auVar54);
                    auVar57 = ZEXT3264(auVar56);
                    auVar59 = ZEXT3264(auVar58);
                    auVar60 = ZEXT3264(auVar60._0_32_);
                    auVar61 = ZEXT3264(auVar61._0_32_);
                    auVar62 = ZEXT3264(auVar62._0_32_);
                    auVar63 = ZEXT3264(auVar63._0_32_);
                    local_24b0 = pauVar20;
                    iVar18 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar18 = 6;
          }
        } while (iVar18 == 0);
        if (iVar18 == 6) {
          lVar29 = (ulong)((uint)uVar31 & 0xf) - 8;
          local_24b8 = unaff_R14;
          if (lVar29 != 0) {
            prim = (Primitive *)(uVar31 & 0xfffffffffffffff0);
            do {
              auVar45 = ZEXT1664(auVar45._0_16_);
              auVar49 = ZEXT1664(auVar49._0_16_);
              auVar53 = ZEXT1664(auVar53._0_16_);
              InstanceArrayIntersector1MB::intersect(&local_24e1,ray,context,prim);
              prim = prim + 1;
              lVar29 = lVar29 + -1;
            } while (lVar29 != 0);
          }
          fVar9 = (ray->super_RayK<1>).tfar;
          auVar32 = ZEXT3264(CONCAT428(fVar9,CONCAT424(fVar9,CONCAT420(fVar9,CONCAT416(fVar9,
                                                  CONCAT412(fVar9,CONCAT48(fVar9,CONCAT44(fVar9,
                                                  fVar9))))))));
          auVar55 = ZEXT3264(local_23c0);
          auVar57 = ZEXT3264(local_23e0);
          auVar59 = ZEXT3264(local_2400);
          auVar60 = ZEXT3264(local_2420);
          auVar61 = ZEXT3264(local_2440);
          auVar62 = ZEXT3264(local_2460);
          auVar63 = ZEXT3264(local_2480);
          uVar25 = local_24d0;
          uVar26 = local_24d8;
          uVar27 = local_24e0;
          uVar28 = local_24c0;
          uVar30 = local_24c8;
          unaff_R14 = local_24b8;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }